

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TQualifier::getLayoutPackingString(TLayoutPacking packing)

{
  char *pcStack_10;
  TLayoutPacking packing_local;
  
  switch(packing) {
  case ElpShared:
    pcStack_10 = "shared";
    break;
  case ElpStd140:
    pcStack_10 = "std140";
    break;
  case ElpStd430:
    pcStack_10 = "std430";
    break;
  case ElpPacked:
    pcStack_10 = "packed";
    break;
  case ElpScalar:
    pcStack_10 = "scalar";
    break;
  default:
    pcStack_10 = "none";
  }
  return pcStack_10;
}

Assistant:

static const char* getLayoutPackingString(TLayoutPacking packing)
    {
        switch (packing) {
        case ElpStd140:   return "std140";
        case ElpPacked:   return "packed";
        case ElpShared:   return "shared";
        case ElpStd430:   return "std430";
        case ElpScalar:   return "scalar";
        default:          return "none";
        }
    }